

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

int32_t ures_flushCache(void)

{
  bool bVar1;
  UHashElement *e_00;
  UBool deletedMore;
  UHashElement *e;
  int32_t rbDeletedNum;
  int32_t pos;
  UResourceDataEntry *resB;
  
  e._0_4_ = 0;
  umtx_lock_63(&resbMutex);
  if (cache == (UHashtable *)0x0) {
    umtx_unlock_63(&resbMutex);
    resB._4_4_ = 0;
  }
  else {
    do {
      bVar1 = false;
      e._4_4_ = 0xffffffff;
      while (e_00 = uhash_nextElement_63(cache,(int32_t *)((long)&e + 4)),
            e_00 != (UHashElement *)0x0) {
        _rbDeletedNum = (UResourceDataEntry *)(e_00->value).pointer;
        if (_rbDeletedNum->fCountExisting == 0) {
          e._0_4_ = (int)e + 1;
          bVar1 = true;
          uhash_removeElement_63(cache,e_00);
          free_entry(_rbDeletedNum);
        }
      }
    } while (bVar1);
    umtx_unlock_63(&resbMutex);
    resB._4_4_ = (int)e;
  }
  return resB._4_4_;
}

Assistant:

static int32_t ures_flushCache()
{
    UResourceDataEntry *resB;
    int32_t pos;
    int32_t rbDeletedNum = 0;
    const UHashElement *e;
    UBool deletedMore;

    /*if shared data hasn't even been lazy evaluated yet
    * return 0
    */
    umtx_lock(&resbMutex);
    if (cache == NULL) {
        umtx_unlock(&resbMutex);
        return 0;
    }

    do {
        deletedMore = FALSE;
        /*creates an enumeration to iterate through every element in the table */
        pos = UHASH_FIRST;
        while ((e = uhash_nextElement(cache, &pos)) != NULL)
        {
            resB = (UResourceDataEntry *) e->value.pointer;
            /* Deletes only if reference counter == 0
             * Don't worry about the children of this node.
             * Those will eventually get deleted too, if not already.
             * Don't worry about the parents of this node.
             * Those will eventually get deleted too, if not already.
             */
            /* 04/05/2002 [weiv] fCountExisting should now be accurate. If it's not zero, that means that    */
            /* some resource bundles are still open somewhere. */

            if (resB->fCountExisting == 0) {
                rbDeletedNum++;
                deletedMore = TRUE;
                uhash_removeElement(cache, e);
                free_entry(resB);
            }
        }
        /*
         * Do it again to catch bundles (aliases, pool bundle) whose fCountExisting
         * got decremented by free_entry().
         */
    } while(deletedMore);
    umtx_unlock(&resbMutex);

    return rbDeletedNum;
}